

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

void balloc_before(AR *ar,Pointer address,Pointer *client_space,ulongi *nbytes)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  int diff;
  size_t mask;
  ulongi B_client_space;
  ulongi B_base;
  ulongi B_address;
  int L_gap2;
  int L_gap1;
  Pointer A_client_space;
  ulongi L_client_space;
  Integer datatype;
  ulongi *nbytes_local;
  Pointer *client_space_local;
  Pointer address_local;
  AR *ar_local;
  
  lVar1 = ar->datatype;
  lVar3 = ar->nelem * (long)ma_sizeof[lVar1];
  L_gap2 = (int)((ulong)(address + ((-4 - lVar3) - (long)ma_base[lVar1])) %
                (ulong)(long)ma_sizeof[lVar1]);
  if (L_gap2 < 0) {
    L_gap2 = ma_sizeof[lVar1] + L_gap2;
  }
  A_client_space = address + ((-4 - (long)L_gap2) - lVar3);
  if (((0 < ma_numalign) &&
      (uVar2 = (uint)A_client_space & (1 << ((byte)ma_numalign & 0x1f)) - 1U, uVar2 != 0)) &&
     ((int)uVar2 % ma_sizeof[lVar1] == 0)) {
    A_client_space = A_client_space + -(long)(int)uVar2;
  }
  *client_space = A_client_space;
  *nbytes = (ulongi)(address +
                    ((long)(int)((int)A_client_space - 0x54U & 7) - (long)A_client_space) + 0x54);
  return;
}

Assistant:

private void balloc_before(ar, address, client_space, nbytes)
    AR        *ar;        /* allocation request */
    Pointer    address;    /* to allocate before */
    Pointer    *client_space;    /* RETURN: location of client_space */
    ulongi    *nbytes;    /* RETURN: length of block */
{
    Integer    datatype;    /* of elements in this block */
    ulongi    L_client_space;    /* length of client_space */
    Pointer    A_client_space;    /* address of client_space */
    int        L_gap1;        /* length of gap1 */
    int        L_gap2;        /* length of gap2 */

    ulongi    B_address;    /* byte equivalent of address */
    ulongi    B_base;        /* byte equivalent of ma_base[datatype] */
    ulongi    B_client_space;    /* byte equivalent of A_client_space */

    datatype = ar->datatype;

    B_address = p2b(address);
    B_base = p2b(ma_base[datatype]);

    /*
     * To ensure that client_space is properly aligned:
     *
     *    (A(client_space) - ma_base[datatype]) % ma_sizeof[datatype] == 0
     *
     * where
     *
     *    A(client_space) == address - L(gap2) - L(guard2) - L(client_space)
     */

    L_client_space = ar->nelem * ma_sizeof[datatype];

    L_gap2 = (B_address
        - sizeof(Guard)
        - L_client_space
        - B_base)
        % ma_sizeof[datatype];

    if (L_gap2 < 0)
        L_gap2 += ma_sizeof[datatype];

    B_client_space = B_address - L_gap2 - sizeof(Guard) - L_client_space;
    A_client_space = b2p(B_client_space);
    B_client_space = p2b(A_client_space);

    /*
     * To align client space according to overall alignment of absolute
     * address on user requested 2^ma_numalign boundary.
     * Note that if the base arrays are not aligned accordingly then
     * this alignement request is not satisfiable and will be quietly
     * ignored.
     */

    if (ma_numalign > 0) {
      size_t mask = (1<<ma_numalign)-1;
      int diff = ((size_t) B_client_space) & mask;
      
      /* Check that the difference is a multiple of the type size.
       * If so, then we can shift the client space which is already
       * aligned to satisfy this requirement.
       */

      if (diff) {
    if ((diff % ma_sizeof[datatype]) == 0 ) {
      /* printf("bbefore realigned diff=%d\n",diff); */
      A_client_space = b2p(B_client_space - diff);
      B_client_space = p2b(A_client_space);
    }    
    /*    else {
      printf("did not realign diff=%d typelen=%d mod=%d\n",
         diff, ma_sizeof[datatype], (diff % ma_sizeof[datatype]));
         }*/
      }
    }

    /*
     * To ensure that the AD is properly aligned:
     *
     *    A(AD) % ALIGNMENT == 0
     *
     * where
     *
     *    A(AD) == A(client_space) - L(guard1) - L(gap1) - L(AD)
     */

    L_gap1 = (B_client_space
        - sizeof(Guard)
        - sizeof(AD))
        % ALIGNMENT;

    /*
     * set the return values
     */

    *client_space = A_client_space;
    *nbytes = (ulongi)(B_address
        - B_client_space
        + sizeof(Guard)
        + L_gap1
        + sizeof(AD));
}